

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O1

void av1_tpl_rdmult_setup(AV1_COMP *cpi)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  TplDepFrame *pTVar4;
  long lVar5;
  double *pdVar6;
  uint uVar7;
  int mi_col;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  int mi_row;
  int iVar18;
  double dVar19;
  double mc_dep_cost;
  double dVar20;
  double dVar21;
  ulong local_70;
  
  pTVar4 = (cpi->ppi->tpl_data).tpl_frame;
  uVar13 = (ulong)((uint)cpi->gf_frame_index * 0x60);
  if (*(char *)((long)pTVar4->ref_map_index + (uVar13 - 0x20)) != '\0') {
    iVar2 = (cpi->common).mi_params.mi_rows;
    bVar1 = (cpi->ppi->tpl_data).tpl_stats_block_mis_log2;
    iVar11 = 1 << (bVar1 & 0x1f);
    if (0 < iVar2) {
      lVar5 = *(long *)((long)pTVar4->ref_map_index + (uVar13 - 0x18));
      iVar3 = *(int *)((long)pTVar4->ref_map_index + uVar13 + 0x20);
      uVar15 = (cpi->common).superres_upscaled_width + 7 >> 2 & 0xfffffffe;
      uVar14 = iVar2 + 3U >> 2;
      iVar18 = uVar15 + 6;
      if (-1 < (int)(uVar15 + 3)) {
        iVar18 = uVar15 + 3;
      }
      uVar7 = iVar18 >> 2;
      uVar16 = 1;
      if (1 < (int)uVar7) {
        uVar16 = (ulong)uVar7;
      }
      if (uVar14 < 2) {
        uVar14 = 1;
      }
      local_70 = 0;
      do {
        if (0 < (int)uVar15) {
          pdVar6 = cpi->tpl_rdmult_scaling_factors;
          uVar12 = 0;
          do {
            dVar19 = 0.0;
            uVar10 = local_70 * 4 & 0xffffffff;
            dVar20 = 0.0;
            do {
              iVar18 = (int)uVar10;
              uVar10 = uVar12 * 4 & 0xffffffff;
              do {
                iVar8 = (int)uVar10;
                if ((iVar18 < iVar2) && (iVar8 < (int)uVar15)) {
                  lVar17 = (long)((iVar8 >> (bVar1 & 0x1f)) + (iVar18 >> (bVar1 & 0x1f)) * iVar3) *
                           200;
                  dVar21 = (double)(*(long *)(lVar5 + 0x18 + lVar17) << 7);
                  dVar19 = dVar19 + dVar21;
                  dVar20 = dVar20 + (double)(*(long *)(lVar5 + 0x48 + lVar17) * 0x80 +
                                            ((long)*(int *)((long)pTVar4->ref_map_index +
                                                           uVar13 + 0x34) *
                                             *(long *)(lVar5 + 0x40 + lVar17) + 0x100 >> 9)) +
                                    dVar21;
                }
                uVar9 = iVar8 + iVar11;
                uVar10 = (ulong)uVar9;
              } while ((long)(int)uVar9 < (long)(uVar12 * 4 + 4));
              uVar9 = iVar18 + iVar11;
              uVar10 = (ulong)uVar9;
            } while ((long)(int)uVar9 < (long)(local_70 * 4 + 4));
            pdVar6[local_70 * uVar7 + uVar12] = (dVar19 / dVar20) / (cpi->rd).r0 + 1.2;
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar16);
        }
        local_70 = local_70 + 1;
      } while (local_70 != uVar14);
    }
  }
  return;
}

Assistant:

void av1_tpl_rdmult_setup(AV1_COMP *cpi) {
  const AV1_COMMON *const cm = &cpi->common;
  const int tpl_idx = cpi->gf_frame_index;

  assert(
      IMPLIES(cpi->ppi->gf_group.size > 0, tpl_idx < cpi->ppi->gf_group.size));

  TplParams *const tpl_data = &cpi->ppi->tpl_data;
  const TplDepFrame *const tpl_frame = &tpl_data->tpl_frame[tpl_idx];

  if (!tpl_frame->is_valid) return;

  const TplDepStats *const tpl_stats = tpl_frame->tpl_stats_ptr;
  const int tpl_stride = tpl_frame->stride;
  const int mi_cols_sr = av1_pixels_to_mi(cm->superres_upscaled_width);

  const int block_size = BLOCK_16X16;
  const int num_mi_w = mi_size_wide[block_size];
  const int num_mi_h = mi_size_high[block_size];
  const int num_cols = (mi_cols_sr + num_mi_w - 1) / num_mi_w;
  const int num_rows = (cm->mi_params.mi_rows + num_mi_h - 1) / num_mi_h;
  const double c = 1.2;
  const int step = 1 << tpl_data->tpl_stats_block_mis_log2;

  // Loop through each 'block_size' X 'block_size' block.
  for (int row = 0; row < num_rows; row++) {
    for (int col = 0; col < num_cols; col++) {
      double intra_cost = 0.0, mc_dep_cost = 0.0;
      // Loop through each mi block.
      for (int mi_row = row * num_mi_h; mi_row < (row + 1) * num_mi_h;
           mi_row += step) {
        for (int mi_col = col * num_mi_w; mi_col < (col + 1) * num_mi_w;
             mi_col += step) {
          if (mi_row >= cm->mi_params.mi_rows || mi_col >= mi_cols_sr) continue;
          const TplDepStats *this_stats = &tpl_stats[av1_tpl_ptr_pos(
              mi_row, mi_col, tpl_stride, tpl_data->tpl_stats_block_mis_log2)];
          int64_t mc_dep_delta =
              RDCOST(tpl_frame->base_rdmult, this_stats->mc_dep_rate,
                     this_stats->mc_dep_dist);
          intra_cost += (double)(this_stats->recrf_dist << RDDIV_BITS);
          mc_dep_cost +=
              (double)(this_stats->recrf_dist << RDDIV_BITS) + mc_dep_delta;
        }
      }
      const double rk = intra_cost / mc_dep_cost;
      const int index = row * num_cols + col;
      cpi->tpl_rdmult_scaling_factors[index] = rk / cpi->rd.r0 + c;
    }
  }
}